

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  InputLess<tcu::Vector<float,_3>_> local_1a;
  InputLess<tcu::Vector<float,_3>_> local_19;
  
  bVar3 = InputLess<tcu::Vector<float,_3>_>::operator()
                    (&local_1a,(Vector<float,_3> *)in1,(Vector<float,_3> *)in2);
  bVar6 = true;
  if (!bVar3) {
    bVar3 = InputLess<tcu::Vector<float,_3>_>::operator()
                      (&local_19,(Vector<float,_3> *)in2,(Vector<float,_3> *)in1);
    if (!bVar3) {
      iVar1 = (in1->
              super_Tuple4<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b.m_data[0];
      iVar2 = (in2->
              super_Tuple4<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b.m_data[0];
      if (iVar1 < iVar2) {
        return true;
      }
      if (iVar1 <= iVar2) {
        uVar5 = 0;
        do {
          uVar4 = uVar5;
          uVar5 = uVar4;
          if (uVar4 == 2) goto LAB_009e98fe;
          iVar1 = (in1->
                  super_Tuple4<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                  ).b.m_data[uVar4 + 1];
          iVar2 = (in2->
                  super_Tuple4<tcu::Vector<float,_3>,_tcu::Vector<int,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
                  ).b.m_data[uVar4 + 1];
          if (iVar1 < iVar2) {
            uVar5 = 1;
            goto LAB_009e98fe;
          }
          uVar5 = uVar4 + 1;
        } while (iVar1 <= iVar2);
        uVar5 = 0;
LAB_009e98fe:
        if ((uVar4 < 2 & (byte)uVar5) != 0) {
          return true;
        }
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}